

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::web_connection_base::add_headers
          (web_connection_base *this,string *request,session_settings *sett,bool using_proxy)

{
  int iVar1;
  session_settings *psVar2;
  ulong uVar3;
  pointer pcVar4;
  pointer ppVar5;
  string *psVar6;
  long *plVar7;
  size_type *psVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *h;
  long lVar9;
  pointer ppVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_90 [8];
  bool local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  ::std::__cxx11::string::append((char *)request);
  ::std::__cxx11::string::_M_append((char *)request,(ulong)(this->m_host)._M_dataplus._M_p);
  if ((this->super_peer_connection).field_0x888 == '\0') {
    psVar2 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
    local_90 = (undefined1  [8])&psVar2->m_mutex;
    local_88 = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
    local_88 = true;
    uVar3 = (psVar2->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
    if ((uVar3 >> 0x2d & 1) != 0) goto LAB_0039159c;
  }
  else {
LAB_0039159c:
    psVar2 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
    local_90 = (undefined1  [8])&psVar2->m_mutex;
    local_88 = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
    local_88 = true;
    uVar3 = (psVar2->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
    if ((uVar3 >> 0x26 & 1) == 0) {
      ::std::__cxx11::string::append((char *)request);
      psVar6 = session_settings::get_str_abi_cxx11_
                         ((this->super_peer_connection).super_peer_connection_hot_members.m_settings
                          ,0);
      ::std::__cxx11::string::_M_append((char *)request,(ulong)(psVar6->_M_dataplus)._M_p);
    }
  }
  if ((this->m_external_auth)._M_string_length == 0) {
    if ((this->m_basic_auth)._M_string_length == 0) goto LAB_00391659;
    lVar9 = 0x900;
  }
  else {
    lVar9 = 0x960;
  }
  ::std::__cxx11::string::append((char *)request);
  ::std::__cxx11::string::_M_append
            ((char *)request,
             *(ulong *)((long)&(this->super_peer_connection).super_bandwidth_socket.
                               _vptr_bandwidth_socket + lVar9));
LAB_00391659:
  local_90 = (undefined1  [8])&sett->m_mutex;
  local_88 = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
  local_88 = true;
  iVar1 = (sett->m_store).m_ints._M_elems[0x7b];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
  if (iVar1 == 5) {
    ::std::__cxx11::string::append((char *)request);
    psVar6 = session_settings::get_str_abi_cxx11_(sett,7);
    pcVar4 = (psVar6->_M_dataplus)._M_p;
    local_70[0] = local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar4,pcVar4 + psVar6->_M_string_length);
    ::std::__cxx11::string::append((char *)local_70);
    psVar6 = session_settings::get_str_abi_cxx11_(sett,8);
    plVar7 = (long *)::std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)(psVar6->_M_dataplus)._M_p);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_50.field_2._M_allocated_capacity = *psVar8;
      local_50.field_2._8_8_ = plVar7[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar8;
      local_50._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_50._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    base64encode((string *)local_90,&local_50);
    ::std::__cxx11::string::_M_append((char *)request,(ulong)local_90);
    if (local_90 != (undefined1  [8])&local_80) {
      operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  ppVar5 = (this->m_extra_headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar10 = (this->m_extra_headers).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar5; ppVar10 = ppVar10 + 1
      ) {
    ::std::__cxx11::string::append((char *)request);
    ::std::__cxx11::string::_M_append((char *)request,(ulong)(ppVar10->first)._M_dataplus._M_p);
    ::std::__cxx11::string::append((char *)request);
    ::std::__cxx11::string::_M_append((char *)request,(ulong)(ppVar10->second)._M_dataplus._M_p);
  }
  if (using_proxy) {
    ::std::__cxx11::string::append((char *)request);
  }
  else if ((this->super_peer_connection).field_0x888 != '\x01') {
    return;
  }
  ::std::__cxx11::string::append((char *)request);
  return;
}

Assistant:

void web_connection_base::add_headers(std::string& request
		, aux::session_settings const& sett, bool const using_proxy) const
	{
		request += "Host: ";
		request += m_host;
		if ((m_first_request || m_settings.get_bool(settings_pack::always_send_user_agent))
			&& !m_settings.get_bool(settings_pack::anonymous_mode))
		{
			request += "\r\nUser-Agent: ";
			request += m_settings.get_str(settings_pack::user_agent);
		}
		if (!m_external_auth.empty())
		{
			request += "\r\nAuthorization: ";
			request += m_external_auth;
		}
		else if (!m_basic_auth.empty())
		{
			request += "\r\nAuthorization: Basic ";
			request += m_basic_auth;
		}
		if (sett.get_int(settings_pack::proxy_type) == settings_pack::http_pw)
		{
			request += "\r\nProxy-Authorization: Basic ";
			request += base64encode(sett.get_str(settings_pack::proxy_username)
				+ ":" + sett.get_str(settings_pack::proxy_password));
		}
		for (auto const& h : m_extra_headers)
		{
			request += "\r\n";
			request += h.first;
			request += ": ";
			request += h.second;
		}
		if (using_proxy) {
			request += "\r\nProxy-Connection: keep-alive";
		}
		if (m_first_request || using_proxy) {
			request += "\r\nConnection: keep-alive";
		}
	}